

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

bool __thiscall
QApplicationPrivate::compressEvent
          (QApplicationPrivate *this,QEvent *event,QObject *receiver,QPostEventList *postedEvents)

{
  ushort uVar1;
  long lVar2;
  undefined1 uVar3;
  uint uVar4;
  long lVar5;
  
  uVar1 = *(ushort *)(event + 8);
  uVar4 = uVar1 - 0x4c;
  if (((0xd < uVar4) || ((0x2007U >> (uVar4 & 0x1f) & 1) == 0)) && (1 < uVar1 - 0xd)) {
    uVar3 = QCoreApplicationPrivate::compressEvent
                      ((QEvent *)this,(QObject *)event,(QPostEventList *)receiver);
    return (bool)uVar3;
  }
  if (*(long *)(postedEvents + 0x10) != 0) {
    lVar5 = 0;
    do {
      if (((*(QObject **)(*(long *)(postedEvents + 8) + lVar5) == receiver) &&
          (lVar2 = *(long *)(*(long *)(postedEvents + 8) + 8 + lVar5), lVar2 != 0)) &&
         (*(ushort *)(lVar2 + 8) == uVar1)) {
        if (uVar1 < 0x4c) {
          if ((uVar1 == 0xd) || (uVar1 == 0xe)) {
            *(undefined8 *)(lVar2 + 0x10) = *(undefined8 *)(event + 0x10);
            goto LAB_002ba21f;
          }
        }
        else {
          if (uVar4 < 2) {
LAB_002ba21f:
            (**(code **)(*(long *)event + 8))(event);
            return true;
          }
          if (uVar1 == 0x4e) {
            QRegion::operator+=((QRegion *)(lVar2 + 0x10),(QRegion *)(event + 0x10));
            goto LAB_002ba21f;
          }
          if (uVar1 == 0x59) goto LAB_002ba21f;
        }
      }
      lVar5 = lVar5 + 0x18;
    } while (*(long *)(postedEvents + 0x10) * 0x18 != lVar5);
  }
  return false;
}

Assistant:

bool QApplicationPrivate::compressEvent(QEvent *event, QObject *receiver, QPostEventList *postedEvents)
{
    // Only compress the following events:
    const QEvent::Type type = event->type();
    switch (type) {
    case QEvent::UpdateRequest:
    case QEvent::UpdateLater:
    case QEvent::LayoutRequest:
    case QEvent::Resize:
    case QEvent::Move:
    case QEvent::LanguageChange:
        break;
    default:
        return QGuiApplicationPrivate::compressEvent(event, receiver, postedEvents);
    }

    for (const auto &postedEvent : std::as_const(*postedEvents)) {

        // Continue, unless a valid event of the same type exists for the same receiver
        if (postedEvent.receiver != receiver
            || !postedEvent.event
            || postedEvent.event->type() != type) {
            continue;
        }

        // Handle type specific compression
        switch (type) {
        case QEvent::Resize:
            static_cast<QResizeEvent *>(postedEvent.event)->m_size =
                static_cast<const QResizeEvent *>(event)->size();
            break;
        case QEvent::Move:
            static_cast<QMoveEvent *>(postedEvent.event)->m_pos =
                static_cast<const QMoveEvent *>(event)->pos();
            break;
        case QEvent::UpdateLater:
            static_cast<QUpdateLaterEvent *>(postedEvent.event)->m_region +=
                static_cast<const QUpdateLaterEvent *>(event)->region();
            break;
        case QEvent::UpdateRequest:
        case QEvent::LanguageChange:
        case QEvent::LayoutRequest:
            break;
        default:
            continue;
        }
        delete event;
        return true;
    }
    return false;
}